

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updatevector.h
# Opt level: O0

void __thiscall
soplex::UpdateVector<double>::UpdateVector
          (UpdateVector<double> *this,int p_dim,shared_ptr<soplex::Tolerances> *tols)

{
  undefined8 in_RDX;
  shared_ptr<soplex::Tolerances> *in_RDI;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff98;
  VectorBase<double> *in_stack_ffffffffffffffb0;
  shared_ptr<soplex::Tolerances> *tol;
  int in_stack_ffffffffffffffcc;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  shared_ptr<soplex::Tolerances> local_28 [2];
  
  VectorBase<double>::VectorBase(in_stack_ffffffffffffffb0,(int)((ulong)in_RDX >> 0x20));
  in_RDI[1].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tol = local_28;
  std::shared_ptr<soplex::Tolerances>::shared_ptr(in_RDI,in_stack_ffffffffffffff98);
  SSVectorBase<double>::SSVectorBase(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,tol);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x201cfb);
  return;
}

Assistant:

explicit
   UpdateVector(int p_dim /*=0*/, std::shared_ptr<Tolerances> tols = nullptr)
      : VectorBase<R> (p_dim)
      , theval(0)
      , thedelta(p_dim, tols)
   {
      assert(isConsistent());
   }